

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
subscribe_event_handler
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          type_index *type_wrapper,control_block_t *limit,agent_t *subscriber)

{
  anon_class_16_2_932dc35e maker;
  agent_t *local_28;
  agent_t *subscriber_local;
  control_block_t *limit_local;
  type_index *type_wrapper_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  maker.limit = (control_block_t **)&subscriber_local;
  maker.subscriber = &local_28;
  local_28 = subscriber;
  subscriber_local = (agent_t *)limit;
  limit_local = (control_block_t *)type_wrapper;
  type_wrapper_local = (type_index *)this;
  insert_or_modify_subscriber<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::subscribe_event_handler(std::type_index_const&,so_5::message_limit::control_block_t_const*,so_5::agent_t*)::_lambda()_1_,so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::subscribe_event_handler(std::type_index_const&,so_5::message_limit::control_block_t_const*,so_5::agent_t*)::_lambda(so_5::impl::local_mbox_details::subscriber_info_t&)_1_>
            (this,type_wrapper,subscriber,maker,(anon_class_8_1_a83d3adb)&subscriber_local);
  return;
}

Assistant:

virtual void
		subscribe_event_handler(
			const std::type_index & type_wrapper,
			const so_5::message_limit::control_block_t * limit,
			agent_t * subscriber ) override
			{
				insert_or_modify_subscriber(
						type_wrapper,
						subscriber,
						[&] {
							return local_mbox_details::subscriber_info_t{
									subscriber, limit };
						},
						[&]( local_mbox_details::subscriber_info_t & info ) {
							info.set_limit( limit );
						} );
			}